

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleGetTexLevelParameterifvTests.cpp
# Opt level: O1

void __thiscall
glcts::MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest::
MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest
          (MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"negative_lod_is_rejected_test",
             "Verifies glGetTexLevelParameter{if}v() rejects negative <lod> by generating GL_INVALID_VALUE error."
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02148450;
  this->float_data = 0.0;
  this->int_data = 0;
  this->to_id = 0;
  return;
}

Assistant:

MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest::
	MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest(Context& context)
	: TestCase(context, "negative_lod_is_rejected_test", "Verifies glGetTexLevelParameter{if}v() rejects negative "
														 "<lod> by generating GL_INVALID_VALUE error.")
	, float_data(0.0f)
	, int_data(0)
	, to_id(0)
{
	/* Left blank on purpose */
}